

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O2

bool kj::_::expectFatalThrow
               (Maybe<kj::Exception::Type> *type,Maybe<kj::StringPtr> *message,
               Function<void_()> *code)

{
  bool bVar1;
  __pid_t __pid;
  int iVar2;
  __pid_t _Var3;
  anon_union_4_1_a8c68091_for_NullableValue<kj::Exception::Type>_2 unaff_EBP;
  bool bVar4;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_helpers_c__:106:5)>
  _kjDefer106;
  FatalThrowExpectation expectation;
  undefined8 local_508;
  undefined8 uStack_500;
  Fault f;
  Exception local_4e8;
  int status;
  
  do {
    __pid = fork();
    if (-1 < __pid) {
      if (__pid == 0) {
        _kjDefer106.maybeFunc.ptr.isSet = true;
        bVar4 = (type->ptr).isSet;
        if (bVar4 == true) {
          unaff_EBP = (type->ptr).field_1;
        }
        bVar1 = (message->ptr).isSet;
        if (bVar1 == true) {
          local_508 = *(undefined8 *)&(message->ptr).field_1;
          uStack_500 = *(undefined8 *)((long)&(message->ptr).field_1 + 8);
        }
        ExceptionCallback::ExceptionCallback(&expectation.super_ExceptionCallback);
        expectation.super_ExceptionCallback._vptr_ExceptionCallback =
             (_func_int **)&PTR__FatalThrowExpectation_0021ec50;
        if (bVar4 != false) {
          expectation.type.ptr.field_1 = unaff_EBP;
        }
        if (bVar1 != false) {
          expectation.message.ptr.field_1._0_4_ = (undefined4)local_508;
          expectation.message.ptr.field_1._4_4_ = local_508._4_4_;
          expectation.message.ptr.field_1.value.content.size_._0_4_ = (undefined4)uStack_500;
          expectation.message.ptr.field_1.value.content.size_._4_4_ = uStack_500._4_4_;
        }
        expectation.type.ptr.isSet = bVar4;
        expectation.message.ptr.isSet = bVar1;
        (**((code->impl).ptr)->_vptr_Iface)();
        status = status & 0xffffff00;
        NullableValue<kj::Exception>::NullableValue
                  ((NullableValue<kj::Exception> *)&f,(NullableValue<kj::Exception> *)&status);
        NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&status);
        if ((char)f.exception == '\x01') {
          if (Debug::minSeverity < 3) {
            Debug::log<char_const(&)[56],kj::Exception&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x6f,ERROR,"\"a non-fatal exception was thrown, but we expected fatal\", e",
                       (char (*) [56])"a non-fatal exception was thrown, but we expected fatal",
                       &local_4e8);
          }
        }
        else if (Debug::minSeverity < 3) {
          Debug::log<char_const(&)[30]>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                     ,0x71,ERROR,"\"no fatal exception was thrown\"",
                     (char (*) [30])"no fatal exception was thrown");
        }
        NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
        anon_unknown_16::FatalThrowExpectation::~FatalThrowExpectation(&expectation);
        Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++:106:5)>
        ::~Deferred(&_kjDefer106);
      }
      goto LAB_001a6a36;
    }
    iVar2 = Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    Debug::Fault::Fault(&f,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                        ,0x68,iVar2,"child = fork()","");
    Debug::Fault::fatal(&f);
  }
LAB_001a6a36:
  do {
    _Var3 = waitpid(__pid,&status,0);
    if (-1 < _Var3) goto LAB_001a6a62;
    iVar2 = Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    Debug::Fault::Fault(&f,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                        ,0x76,iVar2,"waitpid(child, &status, 0)","");
    Debug::Fault::fatal(&f);
  }
LAB_001a6a62:
  f.exception._0_4_ = status & 0x7f;
  if ((uint)f.exception == 0) {
    bVar4 = (status & 0xff00U) == 0;
  }
  else {
    if ((int)((uint)f.exception * 0x1000000 + 0x1000000) < 0x2000000) {
      if (Debug::minSeverity < 3) {
        Debug::log<char_const(&)[39],int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                   ,0x7e,ERROR,"\"subprocess neither exited nor crashed?\", status",
                   (char (*) [39])"subprocess neither exited nor crashed?",&status);
      }
    }
    else if (Debug::minSeverity < 3) {
      Debug::log<char_const(&)[46],int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                 ,0x7b,ERROR,"\"subprocess crashed without throwing exception\", WTERMSIG(status)",
                 (char (*) [46])"subprocess crashed without throwing exception",(int *)&f);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool expectFatalThrow(kj::Maybe<Exception::Type> type, kj::Maybe<StringPtr> message,
                      Function<void()> code) {
#if _WIN32
  // We don't support death tests on Windows due to lack of efficient fork.
  return true;
#else
  pid_t child;
  KJ_SYSCALL(child = fork());
  if (child == 0) {
    KJ_DEFER(_exit(1));
    FatalThrowExpectation expectation(type, message);
    KJ_IF_SOME(e, kj::runCatchingExceptions([&]() {
      code();
    })) {
      KJ_LOG(ERROR, "a non-fatal exception was thrown, but we expected fatal", e);
    } else {
      KJ_LOG(ERROR, "no fatal exception was thrown");
    }
  }

  int status;
  KJ_SYSCALL(waitpid(child, &status, 0));

  if (WIFEXITED(status)) {
    return WEXITSTATUS(status) == 0;
  } else if (WIFSIGNALED(status)) {
    KJ_FAIL_EXPECT("subprocess crashed without throwing exception", WTERMSIG(status));
    return false;
  } else {
    KJ_FAIL_EXPECT("subprocess neither exited nor crashed?", status);
    return false;
  }
#endif
}